

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  _Rb_tree_header *p_Var1;
  pointer pFVar2;
  pointer pLVar3;
  Offset OVar4;
  Result RVar5;
  uint index_00;
  
  pFVar2 = (this->module_->funcs).
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  index_00 = index - ((int)((ulong)((long)(this->func_types_).
                                          super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->func_types_).
                                         super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6) +
                     (int)((ulong)((long)(this->module_->funcs).
                                         super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2)
                          >> 5) * 0x55555555);
  this->func_ = pFVar2 + index_00;
  OVar4 = Istream::end(this->istream_);
  this->func_->code_offset = OVar4;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)&this->depth_fixups_,
             (_Link_type)
             (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var1 = &(this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->label_stack_).
      super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar3) {
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar3;
  }
  FixupMap::Resolve(&this->func_fixups_,this->istream_,index_00);
  RVar5 = SharedValidator::BeginFunctionBody
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     index);
  if (RVar5.enum_ != Error) {
    PushLabel(this,0xffffffff,0xffffffff);
  }
  return (Result)(uint)(RVar5.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  func_fixups_.Resolve(istream_, defined_index);

  CHECK_RESULT(validator_.BeginFunctionBody(loc, index));

  // Push implicit func label (equivalent to return).
  PushLabel();
  return Result::Ok;
}